

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O3

bool __thiscall EOClient::Upload(EOClient *this,FileType type,int id,InitReply init_reply)

{
  _List_node_base *p_Var1;
  pointer puVar2;
  uint uVar3;
  bool bVar4;
  mapped_type *this_00;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  size_t file_start;
  undefined7 in_register_00000031;
  size_t file_length;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  string filename;
  char mapbuf [7];
  string local_1b8;
  char local_197 [7];
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  key_type local_170;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  undefined4 local_110;
  undefined2 local_10c;
  vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_> local_108;
  vector<Pub_File,_std::allocator<Pub_File>_> local_f0;
  undefined4 local_d8;
  undefined2 local_d4;
  vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_> local_d0;
  vector<Pub_File,_std::allocator<Pub_File>_> local_b8;
  undefined4 local_a0;
  undefined2 local_9c;
  vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_> local_98;
  vector<Pub_File,_std::allocator<Pub_File>_> local_80;
  undefined4 local_68;
  undefined2 local_64;
  vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_> local_60;
  vector<Pub_File,_std::allocator<Pub_File>_> local_48;
  
  this->upload_file_id = id;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 1:
    uVar3 = -id;
    if (0 < id) {
      uVar3 = id;
    }
    sprintf(local_197,"%05i",(ulong)uVar3);
    p_Var1 = (this->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"MapDir","");
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var1[0x19]._M_prev,&local_170);
    util::variant::GetString_abi_cxx11_(&local_150,this_00);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_180 = *plVar7;
      lStack_178 = plVar5[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar7;
      local_190 = (long *)*plVar5;
    }
    local_188 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_120 = *plVar7;
      lStack_118 = plVar5[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar7;
      local_130 = (long *)*plVar5;
    }
    local_128 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0013351a;
  case 2:
    p_Var1 = (this->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev[0x16]._M_next;
    local_64 = *(undefined2 *)((long)&p_Var1->_M_next + 4);
    local_68 = *(undefined4 *)&p_Var1->_M_next;
    std::vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>::vector
              (&local_60,
               (vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_> *)&p_Var1->_M_prev)
    ;
    std::vector<Pub_File,_std::allocator<Pub_File>_>::vector
              (&local_48,(vector<Pub_File,_std::allocator<Pub_File>_> *)(p_Var1 + 2));
    if (local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&local_1b8);
      pvVar8 = &(local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
        std::__cxx11::string::_M_assign((string *)&local_1b8);
        bVar4 = true;
        pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    std::vector<Pub_File,_std::allocator<Pub_File>_>::~vector(&local_48);
    std::vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>::~vector(&local_60);
    break;
  case 3:
    p_Var1 = (this->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev[0x16]._M_prev;
    local_9c = *(undefined2 *)((long)&p_Var1->_M_next + 4);
    local_a0 = *(undefined4 *)&p_Var1->_M_next;
    std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::vector
              (&local_98,
               (vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_> *)&p_Var1->_M_prev)
    ;
    std::vector<Pub_File,_std::allocator<Pub_File>_>::vector
              (&local_80,(vector<Pub_File,_std::allocator<Pub_File>_> *)(p_Var1 + 2));
    if (local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&local_1b8);
      pvVar8 = &(local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_80.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
        std::__cxx11::string::_M_assign((string *)&local_1b8);
        bVar4 = true;
        pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    std::vector<Pub_File,_std::allocator<Pub_File>_>::~vector(&local_80);
    std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::~vector(&local_98);
    break;
  case 4:
    p_Var1 = (this->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev[0x17]._M_next;
    local_d4 = *(undefined2 *)((long)&p_Var1->_M_next + 4);
    local_d8 = *(undefined4 *)&p_Var1->_M_next;
    std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::vector
              (&local_d0,
               (vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_> *)&p_Var1->_M_prev)
    ;
    std::vector<Pub_File,_std::allocator<Pub_File>_>::vector
              (&local_b8,(vector<Pub_File,_std::allocator<Pub_File>_> *)(p_Var1 + 2));
    if (local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&local_1b8);
      pvVar8 = &(local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_b8.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
        std::__cxx11::string::_M_assign((string *)&local_1b8);
        bVar4 = true;
        pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    std::vector<Pub_File,_std::allocator<Pub_File>_>::~vector(&local_b8);
    std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::~vector(&local_d0);
    break;
  case 5:
    p_Var1 = (this->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev[0x17]._M_prev;
    local_10c = *(undefined2 *)((long)&p_Var1->_M_next + 4);
    local_110 = *(undefined4 *)&p_Var1->_M_next;
    std::vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>::vector
              (&local_108,
               (vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_> *)&p_Var1->_M_prev)
    ;
    std::vector<Pub_File,_std::allocator<Pub_File>_>::vector
              (&local_f0,(vector<Pub_File,_std::allocator<Pub_File>_> *)(p_Var1 + 2));
    if (local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&local_1b8);
      pvVar8 = &(local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_f0.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
        std::__cxx11::string::_M_assign((string *)&local_1b8);
        bVar4 = true;
        pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    std::vector<Pub_File,_std::allocator<Pub_File>_>::~vector(&local_f0);
    std::vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>::~vector(&local_108);
    break;
  default:
    file_start = 0;
    file_length = 0;
    goto LAB_0013351f;
  }
  if (bVar4) {
    if (pvVar8 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
LAB_0013351a:
      file_length = 0;
      file_start = 0;
LAB_0013351f:
      bVar4 = Upload(this,type,&local_1b8,file_start,file_length,init_reply);
      goto LAB_00133536;
    }
    if (0 < id) {
      uVar6 = (ulong)(uint)id;
      puVar2 = (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar6 < (ulong)((long)(pvVar8->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
        file_start = puVar2[uVar6 - 1];
        file_length = puVar2[uVar6] - file_start;
        goto LAB_0013351f;
      }
    }
  }
  bVar4 = false;
LAB_00133536:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool EOClient::Upload(FileType type, int id, InitReply init_reply)
{
	this->upload_file_id = id;

	std::string filename;
	std::size_t file_start = 0;
	std::size_t file_length = 0;

	std::vector<std::size_t>* file_splits = nullptr;

	auto load_file_splits = [&](auto pub)
	{
		if (pub.files.empty())
			return false;

		Pub_File& first_file = pub.files[0];

		if (pub.files.size() == 1 && first_file.splits.size() > 2)
		{
			filename = first_file.filename;
			file_splits = &first_file.splits;
		}
		else
		{
			if (id - 1 < 0 || id - 1 > pub.files.size())
				return false;

			filename = pub.files[id - 1].filename;
		}

		return true;
	};

	if (type == FILE_MAP)
	{
		char mapbuf[7];
		std::sprintf(mapbuf, "%05i", int(std::abs(id)));
		filename = std::string(server()->world->config["MapDir"]) + mapbuf + ".emf";
	}
	else if (type == FILE_ITEM)
	{
		if (!load_file_splits(*this->server()->world->eif))
			return false;
	}
	else if (type == FILE_NPC)
	{
		if (!load_file_splits(*this->server()->world->enf))
			return false;
	}
	else if (type == FILE_SPELL)
	{
		if (!load_file_splits(*this->server()->world->esf))
			return false;
	}
	else if (type == FILE_CLASS)
	{
		if (!load_file_splits(*this->server()->world->ecf))
			return false;
	}

	if (file_splits)
	{
		if (id < 1 || id >= file_splits->size())
			return false;

		file_start = (*file_splits)[id - 1];
		file_length = (*file_splits)[id] - file_start;
	}

	return EOClient::Upload(type, filename, file_start, file_length, init_reply);
}